

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getblock_request.cc
# Opt level: O3

int __thiscall GetblockRequest::Write(GetblockRequest *this,ByteBuffer *buffer)

{
  NamenodeRequest::Write(&this->super_NamenodeRequest,buffer);
  crail::ByteBuffer::PutLong(buffer,this->fd_);
  crail::ByteBuffer::PutLong(buffer,this->token_);
  crail::ByteBuffer::PutLong(buffer,this->position_);
  crail::ByteBuffer::PutLong(buffer,this->capacity_);
  return 0;
}

Assistant:

int GetblockRequest::Write(ByteBuffer &buffer) {
  NamenodeRequest::Write(buffer);

  buffer.PutLong(fd_);
  buffer.PutLong(token_);
  buffer.PutLong(position_);
  buffer.PutLong(capacity_);

  return 0;
}